

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double folded_normal_cdf(double x,double a,double b)

{
  double dVar1;
  double dVar2;
  double x2;
  double x1;
  double cdf2;
  double cdf1;
  double cdf;
  double b_local;
  double a_local;
  double x_local;
  
  if (0.0 <= x) {
    dVar1 = normal_01_cdf((x - a) / b);
    dVar2 = normal_01_cdf((-x - a) / b);
    cdf1 = dVar1 - dVar2;
  }
  else {
    cdf1 = 0.0;
  }
  return cdf1;
}

Assistant:

double folded_normal_cdf ( double x, double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    FOLDED_NORMAL_CDF evaluates the Folded Normal CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    17 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the CDF.
//    0.0 <= X.
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 <= A,
//    0.0 < B.
//
//    Output, double FOLDED_NORMAL_CDF, the value of the CDF.
//
{
  double cdf;
  double cdf1;
  double cdf2;
  double x1;
  double x2;

  if ( x < 0.0 )
  {
    cdf = 0.0;
  }
  else
  {
    x1 = ( x - a ) / b;
    cdf1 = normal_01_cdf ( x1 );
    x2 = ( - x - a ) / b;
    cdf2 = normal_01_cdf ( x2 );
    cdf = cdf1 - cdf2;
  }

  return cdf;
}